

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O0

ps_mgau_t * s2_semi_mgau_init(acmod_t *acmod)

{
  uint nfeat;
  int iVar1;
  s2_semi_mgau_t *s_00;
  logmath_t *plVar2;
  char *pcVar3;
  char *varfile;
  gauden_t *pgVar4;
  long lVar5;
  uint8 *puVar6;
  vqFeature_t ***pppvVar7;
  uint8 **ppuVar8;
  float64 base;
  double dVar9;
  uint32 local_7c;
  uint32 local_78;
  uint32 local_6c;
  uint32 local_68;
  uint local_60;
  uint local_58;
  int local_40;
  int local_3c;
  int k;
  int j;
  int n_feat;
  int i;
  char *sendump_path;
  ps_mgau_t *ps;
  s2_semi_mgau_t *s;
  acmod_t *acmod_local;
  
  s_00 = (s2_semi_mgau_t *)
         __ckd_calloc__(1,0x80,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                        ,0x4d5);
  s_00->config = acmod->config;
  plVar2 = logmath_retain(acmod->lmath);
  s_00->lmath = plVar2;
  base = logmath_get_base(acmod->lmath);
  plVar2 = logmath_init(base,10,1);
  s_00->lmath_8b = plVar2;
  if (s_00->lmath_8b != (logmath_t *)0x0) {
    iVar1 = logmath_get_width(s_00->lmath_8b);
    if (iVar1 == 1) {
      pcVar3 = ps_config_str(s_00->config,"mean");
      varfile = ps_config_str(s_00->config,"var");
      dVar9 = ps_config_float(s_00->config,"varfloor");
      pgVar4 = gauden_init(pcVar3,varfile,(float32)(float)dVar9,s_00->lmath);
      s_00->g = pgVar4;
      if (pgVar4 == (gauden_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x4e9,"Failed to read means and variances\n");
      }
      else if (s_00->g->n_mgau == 1) {
        nfeat = s_00->g->n_feat;
        if (acmod->fcb->n_sv == 0) {
          local_58 = acmod->fcb->n_stream;
        }
        else {
          local_58 = acmod->fcb->n_sv;
        }
        if (nfeat == local_58) {
          for (j = 0; j < (int)nfeat; j = j + 1) {
            if (acmod->fcb->lda == (mfcc_t ***)0x0) {
              if (acmod->fcb->sv_len == (uint32 *)0x0) {
                local_6c = acmod->fcb->stream_len[j];
              }
              else {
                local_6c = acmod->fcb->sv_len[j];
              }
              local_68 = local_6c;
            }
            else {
              local_68 = acmod->fcb->out_dim;
            }
            if (s_00->g->featlen[j] != local_68) {
              if (acmod->fcb->lda == (mfcc_t ***)0x0) {
                if (acmod->fcb->sv_len == (uint32 *)0x0) {
                  local_7c = acmod->fcb->stream_len[j];
                }
                else {
                  local_7c = acmod->fcb->sv_len[j];
                }
                local_78 = local_7c;
              }
              else {
                local_78 = acmod->fcb->out_dim;
              }
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                      ,0x4fc,"Dimension of stream %d does not match: %d != %d\n",(ulong)(uint)j,
                      (ulong)(uint)s_00->g->featlen[j],local_78);
              goto LAB_0015f78b;
            }
          }
          pcVar3 = ps_config_str(s_00->config,"sendump");
          if (pcVar3 == (char *)0x0) {
            pcVar3 = ps_config_str(s_00->config,"mixw");
            dVar9 = ps_config_float(s_00->config,"mixwfloor");
            iVar1 = read_mixw(s_00,pcVar3,dVar9);
          }
          else {
            iVar1 = read_sendump(s_00,acmod->mdef,pcVar3);
          }
          if (-1 < iVar1) {
            lVar5 = ps_config_int(s_00->config,"ds");
            s_00->ds_ratio = (int16)lVar5;
            puVar6 = (uint8 *)__ckd_calloc__((long)(int)nfeat,1,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                             ,0x50f);
            s_00->topn_beam = puVar6;
            lVar5 = ps_config_int(s_00->config,"topn");
            s_00->max_topn = (int16)lVar5;
            pcVar3 = ps_config_str(s_00->config,"topn_beam");
            split_topn(pcVar3,s_00->topn_beam,nfeat);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                    ,0x512,"Maximum top-N: %d ",(ulong)(uint)(int)s_00->max_topn);
            err_msg(ERR_INFO,(char *)0x0,0,"Top-N beams:");
            for (j = 0; j < (int)nfeat; j = j + 1) {
              err_msg(ERR_INFO,(char *)0x0,0," %d",(ulong)s_00->topn_beam[j]);
            }
            err_msg(ERR_INFO,(char *)0x0,0,"\n");
            lVar5 = ps_config_int(s_00->config,"pl_window");
            s_00->n_topn_hist = (int)lVar5 + 2;
            pppvVar7 = (vqFeature_t ***)
                       __ckd_calloc_3d__((long)s_00->n_topn_hist,(long)(int)nfeat,
                                         (long)s_00->max_topn,8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                         ,0x51d);
            s_00->topn_hist = pppvVar7;
            ppuVar8 = (uint8 **)
                      __ckd_calloc_2d__((long)s_00->n_topn_hist,(long)(int)nfeat,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                        ,0x51f);
            s_00->topn_hist_n = ppuVar8;
            for (j = 0; j < s_00->n_topn_hist; j = j + 1) {
              for (local_3c = 0; local_3c < (int)nfeat; local_3c = local_3c + 1) {
                for (local_40 = 0; local_40 < s_00->max_topn; local_40 = local_40 + 1) {
                  s_00->topn_hist[j][local_3c][local_40].score = -0x80000000;
                  s_00->topn_hist[j][local_3c][local_40].codeword = local_40;
                }
              }
            }
            (s_00->base).vt = &s2_semi_mgau_funcs;
            return &s_00->base;
          }
        }
        else {
          if (acmod->fcb->n_sv == 0) {
            local_60 = acmod->fcb->n_stream;
          }
          else {
            local_60 = acmod->fcb->n_sv;
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x4f6,"Number of streams does not match: %d != %d\n",(ulong)nfeat,(ulong)local_60
                 );
        }
      }
    }
    else {
      logmath_get_base(s_00->lmath_8b);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
              ,0x4e0,"Log base %f is too small to represent add table in 8 bits\n");
    }
  }
LAB_0015f78b:
  s2_semi_mgau_free((ps_mgau_t *)s_00);
  return (ps_mgau_t *)0x0;
}

Assistant:

ps_mgau_t *
s2_semi_mgau_init(acmod_t *acmod)
{
    s2_semi_mgau_t *s;
    ps_mgau_t *ps;
    char const *sendump_path;
    int i;
    int n_feat;

    s = ckd_calloc(1, sizeof(*s));
    s->config = acmod->config;

    s->lmath = logmath_retain(acmod->lmath);
    /* Log-add table. */
    s->lmath_8b = logmath_init(logmath_get_base(acmod->lmath), SENSCR_SHIFT, TRUE);
    if (s->lmath_8b == NULL)
        goto error_out;
    /* Ensure that it is only 8 bits wide so that fast_logmath_add() works. */
    if (logmath_get_width(s->lmath_8b) != 1) {
        E_ERROR("Log base %f is too small to represent add table in 8 bits\n",
                logmath_get_base(s->lmath_8b));
        goto error_out;
    }

    /* Read means and variances. */
    if ((s->g = gauden_init(ps_config_str(s->config, "mean"),
                            ps_config_str(s->config, "var"),
                            ps_config_float(s->config, "varfloor"),
                            s->lmath)) == NULL) {
        E_ERROR("Failed to read means and variances\n");	
        goto error_out;
    }

    /* Currently only a single codebook is supported. */
    if (s->g->n_mgau != 1)
        goto error_out;

    n_feat = s->g->n_feat;

    /* Verify n_feat and veclen, against acmod. */
    if (n_feat != feat_dimension1(acmod->fcb)) {
        E_ERROR("Number of streams does not match: %d != %d\n",
                n_feat, feat_dimension1(acmod->fcb));
        goto error_out;
    }
    for (i = 0; i < n_feat; ++i) {
        if ((uint32)s->g->featlen[i] != feat_dimension2(acmod->fcb, i)) {
            E_ERROR("Dimension of stream %d does not match: %d != %d\n",
                    i, s->g->featlen[i], feat_dimension2(acmod->fcb, i));
            goto error_out;
        }
    }
    /* Read mixture weights */
    if ((sendump_path = ps_config_str(s->config, "sendump"))) {
        if (read_sendump(s, acmod->mdef, sendump_path) < 0) {
            goto error_out;
        }
    }
    else {
        if (read_mixw(s, ps_config_str(s->config, "mixw"),
                      ps_config_float(s->config, "mixwfloor")) < 0) {
            goto error_out;
        }
    }
    s->ds_ratio = ps_config_int(s->config, "ds");

    /* Determine top-N for each feature */
    s->topn_beam = ckd_calloc(n_feat, sizeof(*s->topn_beam));
    s->max_topn = ps_config_int(s->config, "topn");
    split_topn(ps_config_str(s->config, "topn_beam"), s->topn_beam, n_feat);
    E_INFO("Maximum top-N: %d ", s->max_topn);
    E_INFOCONT("Top-N beams:");
    for (i = 0; i < n_feat; ++i) {
        E_INFOCONT(" %d", s->topn_beam[i]);
    }
    E_INFOCONT("\n");

    /* Top-N scores from recent frames */
    s->n_topn_hist = ps_config_int(s->config, "pl_window") + 2;
    s->topn_hist = (vqFeature_t ***)
        ckd_calloc_3d(s->n_topn_hist, n_feat, s->max_topn,
                      sizeof(***s->topn_hist));
    s->topn_hist_n = ckd_calloc_2d(s->n_topn_hist, n_feat,
                                   sizeof(**s->topn_hist_n));
    for (i = 0; i < s->n_topn_hist; ++i) {
        int j;
        for (j = 0; j < n_feat; ++j) {
            int k;
            for (k = 0; k < s->max_topn; ++k) {
                s->topn_hist[i][j][k].score = WORST_DIST;
                s->topn_hist[i][j][k].codeword = k;
            }
        }
    }

    ps = (ps_mgau_t *)s;
    ps->vt = &s2_semi_mgau_funcs;
    return ps;
error_out:
    s2_semi_mgau_free(ps_mgau_base(s));
    return NULL;
}